

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void google::protobuf::compiler::anon_unknown_0::SortMessages
               (FileDescriptorProto *file_descriptor_proto)

{
  int iVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *descriptor_proto;
  void **ppvVar2;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this;
  int index;
  int iVar3;
  
  iVar1 = *(int *)((long)&file_descriptor_proto->field_0 + 0x28);
  this = &(file_descriptor_proto->field_0)._impl_.message_type_;
  iVar3 = 0;
  index = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
    index = 0;
  }
  for (; iVar3 != index; index = index + 1) {
    descriptor_proto =
         protobuf::internal::RepeatedPtrFieldBase::
         Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                   (&this->super_RepeatedPtrFieldBase,index);
    SortMessages(descriptor_proto);
  }
  ppvVar2 = protobuf::internal::RepeatedPtrFieldBase::elements(&this->super_RepeatedPtrFieldBase);
  std::
  sort<google::protobuf::DescriptorProto**,google::protobuf::compiler::(anonymous_namespace)::CompareDescriptorNames>
            (ppvVar2,ppvVar2 + iVar1);
  return;
}

Assistant:

void SortMessages(FileDescriptorProto* file_descriptor_proto) {
  int size = file_descriptor_proto->message_type_size();
  // recursively sort; we can't guarantee the order of nested messages either
  for (int i = 0; i < size; ++i) {
    SortMessages(file_descriptor_proto->mutable_message_type(i));
  }
  DescriptorProto** data =
      file_descriptor_proto->mutable_message_type()->mutable_data();
  std::sort(data, data + size, CompareDescriptorNames());
}